

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

void __thiscall
brotli::Hashers::WarmupHash<brotli::HashLongestMatch<15,6,10>>
          (Hashers *this,size_t size,uint8_t *dict,HashLongestMatch<15,_6,_10> *hasher)

{
  size_t i;
  long lVar1;
  
  if (hasher->need_init_ == true) {
    memset(hasher,0,0x10000);
    hasher->need_init_ = false;
  }
  for (lVar1 = 0; lVar1 + 3U < size; lVar1 = lVar1 + 1) {
    HashLongestMatch<15,_6,_10>::Store(hasher,dict + lVar1,(uint32_t)lVar1);
  }
  return;
}

Assistant:

void WarmupHash(const size_t size, const uint8_t* dict, Hasher* hasher) {
    hasher->Init();
    for (size_t i = 0; i + Hasher::kHashTypeLength - 1 < size; i++) {
      hasher->Store(&dict[i], static_cast<uint32_t>(i));
    }
  }